

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnSelectExpr
          (BinaryReaderIR *this,Index result_count,Type *result_types)

{
  Result RVar1;
  pointer *__ptr;
  TypeVector results;
  undefined1 local_48 [16];
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_assign_aux<wabt::Type*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_38,result_types,
             result_types + result_count);
  std::make_unique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>&>
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_48);
  local_48._8_8_ = local_48._0_8_;
  local_48._0_8_ = (pointer)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_48 + 8)
                    );
  if ((pointer)local_48._8_8_ != (pointer)0x0) {
    (**(code **)((long)*(Type *)local_48._8_8_ + 8))();
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    (**(code **)((long)*(Type *)local_48._0_8_ + 8))();
  }
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_38);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Index result_count, Type* result_types) {
  TypeVector results;
  results.assign(result_types, result_types + result_count);
  return AppendExpr(std::make_unique<SelectExpr>(results));
}